

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::SupportedSamples
          (ShaderImageLoadStoreBase *this,int required)

{
  bool bVar1;
  ostream *poVar2;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream reason;
  int i;
  int required_local;
  ShaderImageLoadStoreBase *this_local;
  
  reason._372_4_ = required;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x906d,
             (GLint *)&reason.field_0x170);
  bVar1 = (int)reason._368_4_ < (int)reason._372_4_;
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar2 = std::operator<<((ostream *)local_198,"Required ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,reason._372_4_);
    poVar2 = std::operator<<(poVar2," image samples but only ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,reason._368_4_);
    poVar2 = std::operator<<(poVar2," available.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    deqp::SubcaseBase::OutputNotSupported(&this->super_SubcaseBase,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool SupportedSamples(int required)
	{
		int i;
		glGetIntegerv(GL_MAX_IMAGE_SAMPLES, &i);
		if (i >= required)
			return true;
		else
		{
			std::ostringstream reason;
			reason << "Required " << required << " image samples but only " << i << " available." << std::endl;
			OutputNotSupported(reason.str());
			return false;
		}
	}